

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyfiledialogs.c
# Opt level: O0

char * tinyfd_colorChooser(char *aTitle,char *aDefaultHexRGB,uchar *aDefaultRGB,uchar *aoResultRGB)

{
  bool bVar1;
  bool bVar2;
  bool bVar3;
  int iVar4;
  ushort **ppuVar5;
  FILE *__stream;
  char *pcVar6;
  size_t sVar7;
  int lWasXdialog;
  int lWasOsascript;
  int lWasZenity3;
  int i;
  FILE *lIn;
  char *p;
  char **ppcStack_4c8;
  uchar lDefaultRGB [3];
  char *lpDefaultHexRGB;
  char lDefaultHexRGB [8];
  char lDialogString [1024];
  char lTmp [128];
  uchar *aoResultRGB_local;
  uchar *aDefaultRGB_local;
  char *aDefaultHexRGB_local;
  char *aTitle_local;
  
  bVar1 = false;
  bVar2 = false;
  bVar3 = false;
  tinyfd_colorChooser::lBuff[0] = '\0';
  if (aDefaultHexRGB == (char *)0x0) {
    p._5_1_ = *aDefaultRGB;
    p._6_1_ = aDefaultRGB[1];
    p._7_1_ = aDefaultRGB[2];
    RGB2Hex(aDefaultRGB,(char *)&lpDefaultHexRGB);
    ppcStack_4c8 = &lpDefaultHexRGB;
  }
  else {
    Hex2RGB(aDefaultHexRGB,(uchar *)((long)&p + 5));
    ppcStack_4c8 = (char **)aDefaultHexRGB;
  }
  iVar4 = osascriptPresent();
  if (iVar4 == 0) {
    iVar4 = kdialogPresent();
    if (iVar4 == 0) {
      iVar4 = zenity3Present();
      if ((((iVar4 == 0) && (iVar4 = matedialogPresent(), iVar4 == 0)) &&
          (iVar4 = shellementaryPresent(), iVar4 == 0)) && (iVar4 = qarmaPresent(), iVar4 == 0)) {
        iVar4 = xdialogPresent();
        if (iVar4 == 0) {
          iVar4 = tkinter2Present();
          if (iVar4 == 0) {
            iVar4 = tkinter3Present();
            if (iVar4 == 0) {
              if ((aTitle != (char *)0x0) && (iVar4 = strcmp(aTitle,"tinyfd_query"), iVar4 == 0)) {
                pcVar6 = tinyfd_inputBox(aTitle,(char *)0x0,(char *)0x0);
                return pcVar6;
              }
              pcVar6 = tinyfd_inputBox(aTitle,"Enter hex rgb color (i.e. #f5ca20)",
                                       (char *)ppcStack_4c8);
              if ((pcVar6 != (char *)0x0) &&
                 ((sVar7 = strlen(pcVar6), sVar7 == 7 && (*pcVar6 == '#')))) {
                lWasOsascript = 1;
                while( true ) {
                  if (6 < lWasOsascript) {
                    Hex2RGB(pcVar6,aoResultRGB);
                    return pcVar6;
                  }
                  ppuVar5 = __ctype_b_loc();
                  if (((*ppuVar5)[(int)pcVar6[lWasOsascript]] & 0x1000) == 0) break;
                  lWasOsascript = lWasOsascript + 1;
                }
                return (char *)0x0;
              }
              return (char *)0x0;
            }
            if ((aTitle != (char *)0x0) && (iVar4 = strcmp(aTitle,"tinyfd_query"), iVar4 == 0)) {
              strcpy(tinyfd_response,"python3-tkinter");
              return (char *)0x1;
            }
            strcpy(lDefaultHexRGB,gPython3Name);
            strcat(lDefaultHexRGB,
                   " -S -c \"import tkinter;from tkinter import colorchooser;root=tkinter.Tk();root.withdraw();"
                  );
            strcat(lDefaultHexRGB,"res=colorchooser.askcolor(color=\'");
            strcat(lDefaultHexRGB,(char *)ppcStack_4c8);
            strcat(lDefaultHexRGB,"\'");
            if ((aTitle != (char *)0x0) && (sVar7 = strlen(aTitle), sVar7 != 0)) {
              strcat(lDefaultHexRGB,",title=\'");
              strcat(lDefaultHexRGB,aTitle);
              strcat(lDefaultHexRGB,"\'");
            }
            strcat(lDefaultHexRGB,");\nif res[1] is not None:\n\tprint(res[1])\"");
          }
          else {
            if ((aTitle != (char *)0x0) && (iVar4 = strcmp(aTitle,"tinyfd_query"), iVar4 == 0)) {
              strcpy(tinyfd_response,"python2-tkinter");
              return (char *)0x1;
            }
            strcpy(lDefaultHexRGB,gPython2Name);
            iVar4 = isTerminalRunning();
            if ((iVar4 == 0) && (iVar4 = isDarwin(), iVar4 != 0)) {
              strcat(lDefaultHexRGB," -i");
            }
            strcat(lDefaultHexRGB,
                   " -S -c \"import Tkinter,tkColorChooser;root=Tkinter.Tk();root.withdraw();");
            iVar4 = isDarwin();
            if (iVar4 != 0) {
              strcat(lDefaultHexRGB,
                     "import os;os.system(\'\'\'osascript -e \'tell app \\\"Finder\\\" to set frontmost of process \\\"Python\\\" to true\' \'\'\');"
                    );
            }
            strcat(lDefaultHexRGB,"res=tkColorChooser.askcolor(color=\'");
            strcat(lDefaultHexRGB,(char *)ppcStack_4c8);
            strcat(lDefaultHexRGB,"\'");
            if ((aTitle != (char *)0x0) && (sVar7 = strlen(aTitle), sVar7 != 0)) {
              strcat(lDefaultHexRGB,",title=\'");
              strcat(lDefaultHexRGB,aTitle);
              strcat(lDefaultHexRGB,"\'");
            }
            strcat(lDefaultHexRGB,");\nif res[1] is not None:\n\tprint res[1]\"");
          }
        }
        else {
          if ((aTitle != (char *)0x0) && (iVar4 = strcmp(aTitle,"tinyfd_query"), iVar4 == 0)) {
            strcpy(tinyfd_response,"xdialog");
            return (char *)0x1;
          }
          bVar3 = true;
          strcpy(lDefaultHexRGB,"Xdialog --colorsel \"");
          if ((aTitle != (char *)0x0) && (sVar7 = strlen(aTitle), sVar7 != 0)) {
            strcat(lDefaultHexRGB,aTitle);
          }
          strcat(lDefaultHexRGB,"\" 0 60 ");
          sprintf(lDialogString + 0x3f8,"%hhu %hhu %hhu",(ulong)p._5_1_,(ulong)p._6_1_,
                  (ulong)p._7_1_);
          strcat(lDefaultHexRGB,lDialogString + 0x3f8);
          strcat(lDefaultHexRGB," 2>&1");
        }
      }
      else {
        bVar1 = true;
        iVar4 = zenity3Present();
        if (iVar4 == 0) {
          iVar4 = matedialogPresent();
          if (iVar4 == 0) {
            iVar4 = shellementaryPresent();
            if (iVar4 == 0) {
              if ((aTitle != (char *)0x0) && (iVar4 = strcmp(aTitle,"tinyfd_query"), iVar4 == 0)) {
                strcpy(tinyfd_response,"qarma");
                return (char *)0x1;
              }
              strcpy(lDefaultHexRGB,"qarma");
              pcVar6 = getenv("SSH_TTY");
              if (pcVar6 == (char *)0x0) {
                strcat(lDefaultHexRGB,
                       " --attach=$(xprop -root 32x \'\t$0\' _NET_ACTIVE_WINDOW | cut -f 2)");
              }
            }
            else {
              if ((aTitle != (char *)0x0) && (iVar4 = strcmp(aTitle,"tinyfd_query"), iVar4 == 0)) {
                strcpy(tinyfd_response,"shellementary");
                return (char *)0x1;
              }
              strcpy(lDefaultHexRGB,"shellementary");
            }
          }
          else {
            if ((aTitle != (char *)0x0) && (iVar4 = strcmp(aTitle,"tinyfd_query"), iVar4 == 0)) {
              strcpy(tinyfd_response,"matedialog");
              return (char *)0x1;
            }
            strcpy(lDefaultHexRGB,"matedialog");
          }
        }
        else {
          if ((aTitle != (char *)0x0) && (iVar4 = strcmp(aTitle,"tinyfd_query"), iVar4 == 0)) {
            strcpy(tinyfd_response,"zenity3");
            return (char *)0x1;
          }
          strcpy(lDefaultHexRGB,"zenity");
          iVar4 = zenity3Present();
          if ((3 < iVar4) && (pcVar6 = getenv("SSH_TTY"), pcVar6 == (char *)0x0)) {
            strcat(lDefaultHexRGB,
                   " --attach=$(sleep .01;xprop -root 32x \'\t$0\' _NET_ACTIVE_WINDOW | cut -f 2)");
          }
        }
        strcat(lDefaultHexRGB," --color-selection --show-palette");
        sVar7 = strlen(lDefaultHexRGB);
        sprintf(lDefaultHexRGB + sVar7," --color=%s",ppcStack_4c8);
        if ((aTitle != (char *)0x0) && (sVar7 = strlen(aTitle), sVar7 != 0)) {
          strcat(lDefaultHexRGB," --title=\"");
          strcat(lDefaultHexRGB,aTitle);
          strcat(lDefaultHexRGB,"\"");
        }
        if (tinyfd_silent != 0) {
          strcat(lDefaultHexRGB," 2>/dev/null ");
        }
      }
    }
    else {
      if ((aTitle != (char *)0x0) && (iVar4 = strcmp(aTitle,"tinyfd_query"), iVar4 == 0)) {
        strcpy(tinyfd_response,"kdialog");
        return (char *)0x1;
      }
      strcpy(lDefaultHexRGB,"kdialog");
      iVar4 = kdialogPresent();
      if (iVar4 == 2) {
        strcat(lDefaultHexRGB," --attach=$(xprop -root 32x \'\t$0\' _NET_ACTIVE_WINDOW | cut -f 2)")
        ;
      }
      sVar7 = strlen(lDefaultHexRGB);
      sprintf(lDefaultHexRGB + sVar7," --getcolor --default \'%s\'",ppcStack_4c8);
      if ((aTitle != (char *)0x0) && (sVar7 = strlen(aTitle), sVar7 != 0)) {
        strcat(lDefaultHexRGB," --title \"");
        strcat(lDefaultHexRGB,aTitle);
        strcat(lDefaultHexRGB,"\"");
      }
    }
  }
  else {
    if ((aTitle != (char *)0x0) && (iVar4 = strcmp(aTitle,"tinyfd_query"), iVar4 == 0)) {
      strcpy(tinyfd_response,"applescript");
      return (char *)0x1;
    }
    bVar2 = true;
    strcpy(lDefaultHexRGB,"osascript");
    iVar4 = osx9orBetter();
    if (iVar4 == 0) {
      strcat(lDefaultHexRGB," -e \'tell application \"System Events\"\' -e \'Activate\'");
      strcat(lDefaultHexRGB," -e \'try\' -e \'set mycolor to choose color default color {");
    }
    else {
      strcat(lDefaultHexRGB,
             " -e \'try\' -e \'tell app (path to frontmost application as Unicode text) to set mycolor to choose color default color {"
            );
    }
    sprintf(lDialogString + 0x3f8,"%d",(ulong)p._5_1_ << 8);
    strcat(lDefaultHexRGB,lDialogString + 0x3f8);
    strcat(lDefaultHexRGB,",");
    sprintf(lDialogString + 0x3f8,"%d",(ulong)p._6_1_ << 8);
    strcat(lDefaultHexRGB,lDialogString + 0x3f8);
    strcat(lDefaultHexRGB,",");
    sprintf(lDialogString + 0x3f8,"%d",(ulong)p._7_1_ << 8);
    strcat(lDefaultHexRGB,lDialogString + 0x3f8);
    strcat(lDefaultHexRGB,"}\' ");
    strcat(lDefaultHexRGB,
           "-e \'set mystring to ((item 1 of mycolor) div 256 as integer) as string\' ");
    strcat(lDefaultHexRGB,"-e \'repeat with i from 2 to the count of mycolor\' ");
    strcat(lDefaultHexRGB,
           "-e \'set mystring to mystring & \" \" & ((item i of mycolor) div 256 as integer) as string\' "
          );
    strcat(lDefaultHexRGB,"-e \'end repeat\' ");
    strcat(lDefaultHexRGB,"-e \'mystring\' ");
    strcat(lDefaultHexRGB,"-e \'on error number -128\' ");
    strcat(lDefaultHexRGB,"-e \'end try\'");
    iVar4 = osx9orBetter();
    if (iVar4 == 0) {
      strcat(lDefaultHexRGB," -e \'end tell\'");
    }
  }
  if (tinyfd_verbose != 0) {
    printf("lDialogString: %s\n",lDefaultHexRGB);
  }
  __stream = popen(lDefaultHexRGB,"r");
  if (__stream == (FILE *)0x0) {
    aTitle_local = (char *)0x0;
  }
  else {
    do {
      pcVar6 = fgets(tinyfd_colorChooser::lBuff,0x80,__stream);
    } while (pcVar6 != (char *)0x0);
    pclose(__stream);
    sVar7 = strlen(tinyfd_colorChooser::lBuff);
    if (sVar7 == 0) {
      aTitle_local = (char *)0x0;
    }
    else {
      sVar7 = strlen(tinyfd_colorChooser::lBuff);
      if (tinyfd_selectFolderDialog::lBuff[sVar7 + 0x3ff] == '\n') {
        sVar7 = strlen(tinyfd_colorChooser::lBuff);
        tinyfd_selectFolderDialog::lBuff[sVar7 + 0x3ff] = '\0';
      }
      if (bVar1) {
        if (tinyfd_colorChooser::lBuff[0] == '#') {
          sVar7 = strlen(tinyfd_colorChooser::lBuff);
          if (7 < sVar7) {
            tinyfd_colorChooser::lBuff[3] = tinyfd_colorChooser::lBuff[5];
            tinyfd_colorChooser::lBuff[4] = tinyfd_colorChooser::lBuff[6];
            tinyfd_colorChooser::lBuff[5] = tinyfd_colorChooser::lBuff[9];
            tinyfd_colorChooser::lBuff[6] = tinyfd_colorChooser::lBuff[10];
            tinyfd_colorChooser::lBuff[7] = '\0';
          }
          Hex2RGB(tinyfd_colorChooser::lBuff,aoResultRGB);
        }
        else if (tinyfd_colorChooser::lBuff[3] == '(') {
          __isoc99_sscanf(tinyfd_colorChooser::lBuff,"rgb(%hhu,%hhu,%hhu",aoResultRGB,
                          aoResultRGB + 1,aoResultRGB + 2);
          RGB2Hex(aoResultRGB,tinyfd_colorChooser::lBuff);
        }
        else if (tinyfd_colorChooser::lBuff[4] == '(') {
          __isoc99_sscanf(tinyfd_colorChooser::lBuff,"rgba(%hhu,%hhu,%hhu",aoResultRGB,
                          aoResultRGB + 1,aoResultRGB + 2);
          RGB2Hex(aoResultRGB,tinyfd_colorChooser::lBuff);
        }
      }
      else if ((bVar2) || (bVar3)) {
        __isoc99_sscanf(tinyfd_colorChooser::lBuff,"%hhu %hhu %hhu",aoResultRGB,aoResultRGB + 1,
                        aoResultRGB + 2);
        RGB2Hex(aoResultRGB,tinyfd_colorChooser::lBuff);
      }
      else {
        Hex2RGB(tinyfd_colorChooser::lBuff,aoResultRGB);
      }
      aTitle_local = tinyfd_colorChooser::lBuff;
    }
  }
  return aTitle_local;
}

Assistant:

char const * tinyfd_colorChooser(
        char const * const aTitle, /* NULL or "" */
        char const * const aDefaultHexRGB, /* NULL or "#FF0000"*/
        unsigned char const aDefaultRGB[3], /* { 0 , 255 , 255 } */
        unsigned char aoResultRGB[3]) /* { 0 , 0 , 0 } */
{
        char lDefaultHexRGB[8];
        char * lpDefaultHexRGB;
        int i;
        char const * p ;

#ifndef TINYFD_NOLIB
        if ( (!tinyfd_forceConsole || !( GetConsoleWindow() || dialogPresent()) )
          && (!getenv("SSH_CLIENT") || getenv("DISPLAY")) )
        {
                if (aTitle&&!strcmp(aTitle,"tinyfd_query")){strcpy(tinyfd_response,"windows");return (char const *)1;}
                if (tinyfd_winUtf8)
                {
                        return colorChooserWinGui8(
                                aTitle, aDefaultHexRGB, aDefaultRGB, aoResultRGB);
                }
                else
                {
                        return colorChooserWinGuiA(
                                aTitle, aDefaultHexRGB, aDefaultRGB, aoResultRGB);
                }
        }
        else
#endif /* TINYFD_NOLIB */
        if ( aDefaultHexRGB )
        {
                lpDefaultHexRGB = (char *) aDefaultHexRGB ;
        }
        else
        {
                RGB2Hex( aDefaultRGB , lDefaultHexRGB ) ;
                lpDefaultHexRGB = (char *) lDefaultHexRGB ;
        }
        p = tinyfd_inputBox(aTitle,
                        "Enter hex rgb color (i.e. #f5ca20)",lpDefaultHexRGB);
        if (aTitle&&!strcmp(aTitle,"tinyfd_query")) return p;

        if ( !p || (strlen(p) != 7) || (p[0] != '#') )
        {
                return NULL ;
        }
        for ( i = 1 ; i < 7 ; i ++ )
        {
                if ( ! isxdigit( p[i] ) )
                {
                        return NULL ;
                }
        }
        Hex2RGB(p,aoResultRGB);
        return p ;
}